

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O2

bool __thiscall libDAI::TreeEP::initProps2(TreeEP *this)

{
  Properties *this_00;
  bool bVar1;
  TypeType TVar2;
  unsigned_long uVar3;
  Exception *this_01;
  double dVar4;
  allocator<char> local_39;
  PropertyKey local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"type",&local_39);
  this_00 = &(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._properties;
  bVar1 = Properties::hasKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tol",&local_39);
    bVar1 = Properties::hasKey(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"maxiter",&local_39);
      bVar1 = Properties::hasKey(this_00,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
        bVar1 = Properties::hasKey(this_00,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"type",&local_39);
          TVar2 = Properties::FromStringTo<libDAI::TreeEP::TypeType>(this_00,&local_38);
          (this->Props2).type.v = TVar2.v;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"tol",&local_39);
          dVar4 = Properties::FromStringTo<double>(this_00,&local_38);
          (this->Props2).tol = dVar4;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"maxiter",&local_39);
          uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
          (this->Props2).maxiter = uVar3;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"verbose",&local_39);
          uVar3 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
          (this->Props2).verbose = uVar3;
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"damping",&local_39);
          bVar1 = Properties::hasKey(this_00,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if (!bVar1) {
            return true;
          }
          this_01 = (Exception *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"treeep.cpp, line 56",&local_39);
          Exception::Exception(this_01,0,&local_38);
          __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
  return false;
}

Assistant:

bool TreeEP::initProps2() {
        if( !HasProperty("type") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props2.type    = FromStringTo<TypeType>("type");
        Props2.tol     = FromStringTo<double>("tol");
        Props2.maxiter = FromStringTo<size_t>("maxiter");
        Props2.verbose = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            DAI_THROW( NOT_IMPLEMENTED );

        return true;
    }